

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactSurfaceMesh.cpp
# Opt level: O3

void __thiscall chrono::fea::ChContactTriangleXYZ::GetSubBlockOffset(ChContactTriangleXYZ *this)

{
  int in_ESI;
  
  GetSubBlockOffset((ChContactTriangleXYZ *)
                    ((long)&(this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.
                            _vptr_ChContactable +
                    (long)(this->super_ChContactable_3vars<3,_3,_3>).super_ChContactable.
                          _vptr_ChContactable[-0xb]),in_ESI);
  return;
}

Assistant:

unsigned int ChContactTriangleXYZ::GetSubBlockOffset(int nblock) {
    if (nblock == 0)
        return GetNode1()->NodeGetOffset_w();
    if (nblock == 1)
        return GetNode2()->NodeGetOffset_w();
    if (nblock == 2)
        return GetNode3()->NodeGetOffset_w();
    return 0;
}